

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arraylist.c
# Opt level: O0

int array_list_expand_internal(array_list *arr,size_t max)

{
  void **ppvVar1;
  ulong local_30;
  size_t new_size;
  void *t;
  size_t max_local;
  array_list *arr_local;
  
  if (max < arr->size) {
    arr_local._4_4_ = 0;
  }
  else {
    local_30 = max;
    if ((arr->size < 0x7fffffffffffffff) && (local_30 = arr->size << 1, local_30 < max)) {
      local_30 = max;
    }
    if (local_30 < 0x2000000000000000) {
      ppvVar1 = (void **)realloc(arr->array,local_30 << 3);
      if (ppvVar1 == (void **)0x0) {
        arr_local._4_4_ = -1;
      }
      else {
        arr->array = ppvVar1;
        arr->size = local_30;
        arr_local._4_4_ = 0;
      }
    }
    else {
      arr_local._4_4_ = -1;
    }
  }
  return arr_local._4_4_;
}

Assistant:

static int array_list_expand_internal(struct array_list *arr, size_t max)
{
	void *t;
	size_t new_size;

	if (max < arr->size)
		return 0;
	/* Avoid undefined behaviour on size_t overflow */
	if (arr->size >= SIZE_T_MAX / 2)
		new_size = max;
	else
	{
		new_size = arr->size << 1;
		if (new_size < max)
			new_size = max;
	}
	if (new_size > (~((size_t)0)) / sizeof(void *))
		return -1;
	if (!(t = realloc(arr->array, new_size * sizeof(void *))))
		return -1;
	arr->array = (void **)t;
	arr->size = new_size;
	return 0;
}